

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

string * antlr::operator+(string *__return_storage_ptr__,string *lhs,int rhs)

{
  char tmp [100];
  
  snprintf(tmp,100,"%d",rhs);
  std::operator+(__return_storage_ptr__,lhs,tmp);
  return __return_storage_ptr__;
}

Assistant:

string operator+( const ANTLR_USE_NAMESPACE(std)string& lhs, const int rhs )
{
	char tmp[100];
	snprintf(tmp,100,"%d",rhs);
	return lhs+tmp;
}